

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartAttribute(xmlTextWriterPtr writer,xmlChar *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlLinkPtr lk_00;
  void *pvVar5;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    writer_local._4_4_ = -1;
  }
  else {
    lk._0_4_ = 0;
    lk_00 = xmlListFront(writer->nodes);
    if (lk_00 == (xmlLinkPtr)0x0) {
      writer_local._4_4_ = -1;
    }
    else {
      pvVar5 = xmlLinkGetData(lk_00);
      if (pvVar5 == (void *)0x0) {
        writer_local._4_4_ = -1;
      }
      else {
        if (*(int *)((long)pvVar5 + 8) != 1) {
          if (*(int *)((long)pvVar5 + 8) != 2) {
            return -1;
          }
          lk._0_4_ = xmlTextWriterEndAttribute(writer);
          if ((int)lk < 0) {
            return -1;
          }
        }
        iVar1 = xmlOutputBufferWriteString(writer->out," ");
        if (iVar1 < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          iVar2 = xmlOutputBufferWriteString(writer->out,(char *)name);
          if (iVar2 < 0) {
            writer_local._4_4_ = -1;
          }
          else {
            iVar3 = xmlOutputBufferWriteString(writer->out,"=");
            if (iVar3 < 0) {
              writer_local._4_4_ = -1;
            }
            else {
              iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
              if (iVar4 < 0) {
                writer_local._4_4_ = -1;
              }
              else {
                writer_local._4_4_ = iVar4 + iVar3 + iVar2 + iVar1 + (int)lk;
                *(undefined4 *)((long)pvVar5 + 8) = 2;
              }
            }
          }
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartAttribute(xmlTextWriterPtr writer, const xmlChar * name)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    DEBUG_ENTER(("xmlTextWriterStartAttribute(%p, %s);\n", writer, name));

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        RETURN_INT(-1);

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0)
        RETURN_INT(-1);

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        RETURN_INT(-1);

    switch (p->state) {
        case XML_TEXTWRITER_ATTRIBUTE:
            count = xmlTextWriterEndAttribute(writer);
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            /* fallthrough */
        case XML_TEXTWRITER_NAME:
            count = xmlOutputBufferWriteString(writer->out, " ");
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            count =
                xmlOutputBufferWriteString(writer->out,
                                           (const char *) name);
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            count = xmlOutputBufferWriteString(writer->out, "=");
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            p->state = XML_TEXTWRITER_ATTRIBUTE;
            break;
        default:
            RETURN_INT(-1);
    }

    RETURN_INT(sum);
}